

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

void __thiscall
slang::parsing::NumberParser::NumberParser
          (NumberParser *this,Diagnostics *diagnostics,BumpAllocator *alloc,
          LanguageVersion languageVersion)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[2] = in_ECX;
  SourceLocation::SourceLocation((SourceLocation *)(in_RDI + 4));
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x19) = 0;
  *(undefined1 *)((long)in_RDI + 0x1a) = 0;
  SVInt::SVInt((SVInt *)0x6900c3);
  *(undefined8 *)(in_RDI + 0xc) = in_RSI;
  *(undefined8 *)(in_RDI + 0xe) = in_RDX;
  SmallVector<slang::logic_t,_40UL>::SmallVector((SmallVector<slang::logic_t,_40UL> *)0x6900e2);
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x6900f2);
  return;
}

Assistant:

NumberParser::NumberParser(Diagnostics& diagnostics, BumpAllocator& alloc,
                           LanguageVersion languageVersion) :
    languageVersion(languageVersion), diagnostics(diagnostics), alloc(alloc) {
}